

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  int offset_;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  InputType type;
  long lVar7;
  bool bVar8;
  GLValue GVar9;
  GLValue GVar10;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      return 3;
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      lVar5 = 0;
LAB_00f6dbee:
      if (lVar5 != 2) {
        piVar4 = &DAT_0183d1f4;
        lVar7 = 0;
        do {
          if (lVar7 == 0) {
            type = (&DAT_0183d1e8)[lVar3];
            iVar1 = deqp::gls::Array::inputTypeSize(type);
            iVar1 = iVar1 * 2;
          }
          else {
            if (lVar7 == 3) goto LAB_00f6ddac;
            iVar1 = *piVar4;
            type = (&DAT_0183d1e8)[lVar3];
          }
          iVar2 = deqp::gls::Array::inputTypeSize(type);
          offset_ = (&DAT_0181a300)[lVar6];
          if (iVar1 % iVar2 == 0) {
            iVar2 = deqp::gls::Array::inputTypeSize(type);
            bVar8 = offset_ % iVar2 == 0;
          }
          else {
            bVar8 = false;
          }
          GVar9 = deqp::gls::GLValue::getMinValue(type);
          GVar10 = deqp::gls::GLValue::getMaxValue(type);
          max_._4_4_ = uStack_d4;
          max_.type = GVar10.type;
          min_._4_4_ = uStack_c4;
          min_.type = GVar9.type;
          min_.field_1 = GVar9.field_1;
          max_.field_1 = GVar10.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&arraySpec,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,offset_,
                     iVar1,false,min_,max_);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          spec.primitive = PRIMITIVE_TRIANGLES;
          spec.drawCount = (&DAT_0181a4e0)[lVar5];
          spec.first = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back(&spec.arrays,&arraySpec);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&name,&spec);
          if (!bVar8) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                       name._M_dataplus._M_p,name._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          std::__cxx11::string::~string((string *)&name);
          std::
          _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::~_Vector_base(&spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         );
          lVar7 = lVar7 + 1;
          piVar4 = piVar4 + 1;
        } while( true );
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
LAB_00f6ddac:
  lVar5 = lVar5 + 1;
  goto LAB_00f6dbee;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
					const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && ((offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	2,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}